

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::ComplexOptionType2::ByteSizeLong(ComplexOptionType2 *this)

{
  RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *this_00;
  uint uVar1;
  long lVar2;
  size_t sVar3;
  void **ppvVar4;
  const_iterator cVar5;
  size_t sVar6;
  ulong uVar7;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  sVar3 = (long)*(int *)((long)&this->field_0 + 0x28) + sVar3;
  this_00 = &(this->field_0)._impl_.barney_;
  ppvVar4 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar5 = google::protobuf::RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4>
          ::end(this_00);
  for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::ComplexOptionType2_ComplexOptionType4>
                      ((ComplexOptionType2_ComplexOptionType4 *)*ppvVar4);
    sVar3 = sVar3 + sVar6;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ComplexOptionType1>((this->field_0)._impl_.bar_);
      sVar3 = sVar3 + sVar6 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ComplexOptionType2_ComplexOptionType4>
                        ((this->field_0)._impl_.fred_);
      sVar3 = sVar3 + sVar6 + 1;
    }
    if ((uVar1 & 4) != 0) {
      uVar7 = (long)(this->field_0)._impl_.baz_ | 1;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t ComplexOptionType2::ByteSizeLong() const {
  const ComplexOptionType2& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.ComplexOptionType2)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.ComplexOptionType2.ComplexOptionType4 barney = 4;
    {
      total_size += 1UL * this_._internal_barney_size();
      for (const auto& msg : this_._internal_barney()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional .proto2_unittest.ComplexOptionType1 bar = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.bar_);
    }
    // optional .proto2_unittest.ComplexOptionType2.ComplexOptionType4 fred = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.fred_);
    }
    // optional int32 baz = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_baz());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}